

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O2

future<void> * __thiscall
mxx::comm::isend<int>
          (future<void> *__return_storage_ptr__,comm *this,int *msg,size_t size,int dest,int tag)

{
  requests *this_00;
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  MPI_Request *ppoVar3;
  datatype dt;
  datatype local_80;
  future_builder<void> f;
  
  if ((dest < 0) || (this->m_size <= dest)) {
    assert_fail("0 <= dest && dest < this->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
                ,0x151,"isend");
  }
  f.m_valid = true;
  f.m_future.super_future_base<void>.m_valid = false;
  f.m_future.super_future_base<void>.m_ever_valid = false;
  this_00 = &f.m_future.super_future_base<void>.m_req;
  f.m_future.super_future_base<void>.m_req._vptr_requests = (_func_int **)&PTR__requests_00148228;
  f.m_future.super_future_base<void>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f.m_future.super_future_base<void>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  f.m_future.super_future_base<void>.m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  f.m_future.super_future_base<void>._vptr_future_base = (_func_int **)&PTR__future_base_00148358;
  if (size < 0x7fffffff) {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00148328;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    poVar1 = this->mpi_comm;
    ppoVar3 = requests::add(this_00);
    MPI_Isend(msg,size & 0xffffffff,&ompi_mpi_int,dest,tag,poVar1,ppoVar3);
  }
  else {
    local_80._vptr_datatype = (_func_int **)&PTR__datatype_00148328;
    local_80.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_80.builtin = true;
    datatype::contiguous(&dt,&local_80,size);
    datatype::~datatype(&local_80);
    poVar2 = dt.mpitype;
    poVar1 = this->mpi_comm;
    ppoVar3 = requests::add(this_00);
    MPI_Isend(msg,1,poVar2,dest,tag,poVar1,ppoVar3);
  }
  datatype::~datatype(&dt);
  future_builder<void>::get_future(__return_storage_ptr__,&f);
  impl::future_base<void>::~future_base(&f.m_future.super_future_base<void>);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<void> isend(const T* msg, size_t size, int dest, int tag = 0) const {
        MXX_ASSERT(0 <= dest && dest < this->size());
        mxx::future_builder<void> f;
        if (size < mxx::max_int) {
            mxx::datatype dt = mxx::get_datatype<T>();
            MPI_Isend(const_cast<T*>(msg), size, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        } else {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
            MPI_Isend(const_cast<T*>(msg), 1, dt.type(), dest, tag, this->mpi_comm, &f.add_request());
        }
        return f.get_future();
    }